

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O0

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::perturbMin(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *uvec,
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *p_low,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *p_up,
            number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *eps,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *p_delta,int start,int incr)

{
  bool bVar1;
  type_conflict5 tVar2;
  int iVar3;
  Status SVar4;
  ulong *puVar5;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  char *pcVar6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar7;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 uVar8;
  undefined8 extraout_RDX_09;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  long in_RDI;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_R8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_R9;
  int in_stack_00000008;
  int in_stack_00000010;
  int j;
  IdxSet *idx;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *upd;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  u;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  l;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxrandom;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minrandom;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_14;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_11;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_9;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_7;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_12;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_10;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_13;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_6;
  undefined4 in_stack_ffffffffffffe388;
  int in_stack_ffffffffffffe38c;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe390;
  double in_stack_ffffffffffffe398;
  cpp_dec_float<200U,_int,_void> *in_stack_ffffffffffffe3a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe3a8;
  undefined7 in_stack_ffffffffffffe3b0;
  undefined1 in_stack_ffffffffffffe3b7;
  type_conflict5 local_1c21;
  type_conflict5 local_1c01;
  undefined7 in_stack_ffffffffffffe410;
  undefined1 in_stack_ffffffffffffe417;
  undefined1 uVar9;
  undefined1 local_1bd0 [96];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe490;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe498;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe4a0;
  Real local_1b50;
  undefined1 local_1b48 [128];
  undefined1 local_1ac8 [128];
  undefined1 local_1a48 [128];
  undefined1 local_19c8 [128];
  undefined1 local_1948 [128];
  undefined1 local_18c8 [128];
  ulong local_1848;
  undefined1 local_1840 [128];
  undefined1 local_17c0 [128];
  undefined1 local_1740 [128];
  Real local_16c0;
  undefined1 local_16b4 [128];
  undefined1 local_1634 [128];
  undefined1 local_15b4 [128];
  undefined1 local_1534 [128];
  undefined1 local_14b4 [128];
  undefined1 local_1434 [128];
  undefined1 local_13b4 [128];
  undefined1 local_1334 [128];
  undefined1 local_12b4 [128];
  uint local_1234;
  IdxSet *local_1230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1228;
  undefined1 local_1220 [128];
  Real local_11a0;
  undefined1 local_1198 [128];
  undefined1 local_1118 [128];
  undefined1 local_1098 [128];
  undefined1 local_1018 [128];
  undefined1 local_f98 [128];
  undefined1 local_f18 [128];
  ulong local_e98;
  undefined1 local_e90 [128];
  undefined1 local_e10 [128];
  undefined1 local_d90 [128];
  Real local_d10;
  undefined1 local_d04 [128];
  undefined1 local_c84 [128];
  undefined1 local_c04 [128];
  undefined1 local_b84 [128];
  undefined1 local_b04 [128];
  undefined1 local_a84 [128];
  undefined1 local_a04 [128];
  undefined1 local_984 [128];
  int local_904;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_900;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_880;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_800;
  undefined8 local_780;
  undefined1 local_778 [128];
  undefined8 local_6f8;
  undefined1 local_6f0 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_670;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_648;
  undefined8 local_638;
  undefined8 local_630;
  undefined1 *local_628;
  undefined8 local_620;
  ulong *local_618;
  undefined1 *local_610;
  undefined8 local_608;
  undefined8 local_600;
  undefined1 *local_5f8;
  undefined8 local_5f0;
  ulong *local_5e8;
  undefined1 *local_5e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5c0;
  undefined1 *local_5b8;
  undefined1 *local_5a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5a0;
  undefined1 *local_598;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_590;
  undefined1 *local_588;
  undefined1 *local_578;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_570;
  undefined1 *local_568;
  undefined1 *local_558;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_550;
  undefined1 *local_548;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_540;
  undefined1 *local_538;
  undefined1 *local_528;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_520;
  undefined1 *local_518;
  undefined1 *local_508;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_500;
  undefined1 *local_4f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4b0;
  undefined1 *local_4a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4a0;
  undefined1 *local_498;
  undefined1 *local_488;
  undefined1 *local_480;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_478;
  undefined1 *local_470;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_468;
  undefined1 *local_460;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_458;
  undefined1 *local_450;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_448;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_440;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_438;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_428;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_420;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_418;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_410;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_408;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_400;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3f0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3e8;
  ulong *local_3d0;
  undefined8 local_3c8;
  ulong *local_3c0;
  undefined8 local_3b8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_3a9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_388;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_380;
  undefined1 *local_378;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_369;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_368;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_348;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_340;
  undefined1 *local_338;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_329;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_328;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_308;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_300;
  undefined1 *local_2f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_2e9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2c0;
  undefined1 *local_2b8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_2a9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_288;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_280;
  undefined1 *local_278;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_269;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_268;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_248;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_240;
  undefined1 *local_238;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_229;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_228;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_208;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_200;
  undefined1 *local_1f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1e9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c0;
  undefined1 *local_1b8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1a9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a8;
  undefined1 *local_1a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_179;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_178;
  undefined8 *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  undefined1 *local_150;
  undefined8 *local_148;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_139;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  undefined8 *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  undefined1 *local_110;
  undefined8 *local_108;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_f9;
  Real *local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  undefined1 *local_d0;
  Real *local_c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b9;
  Real *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  undefined1 *local_90;
  Real *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  Real *local_78;
  cpp_dec_float<200U,_int,_void> *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  cpp_dec_float<200U,_int,_void> *local_58;
  undefined1 *local_50;
  Real *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  Real *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  Real *local_8;
  
  local_648 = in_RSI;
  local_670 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::get_const_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x6c3212);
  local_6f8 = 0x4024000000000000;
  local_128 = local_6f0;
  local_130 = &local_6f8;
  local_138 = in_R9;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_139,in_R9);
  local_120 = local_6f0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390);
  local_110 = local_6f0;
  local_118 = local_138;
  local_108 = local_130;
  boost::multiprecision::default_ops::
  eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
             (cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388),(double *)0x6c32da);
  local_780 = 0x4059000000000000;
  local_168 = local_778;
  local_170 = &local_780;
  local_178 = in_R9;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_179,in_R9);
  local_160 = local_778;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390);
  local_150 = local_778;
  local_158 = local_178;
  local_148 = local_170;
  boost::multiprecision::default_ops::
  eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
             (cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388),(double *)0x6c339a);
  local_5d8 = &local_800;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390);
  local_5d0 = &local_880;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390);
  local_5c8 = &local_900;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390);
  if ((*(byte *)(in_RDI + 0xc38) & 1) == 0) {
    UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::delta(local_648);
    local_1228 = SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::values((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x6c3f13);
    this_00 = UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::delta(local_648);
    local_1230 = SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::indices(this_00);
    UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::delta(local_648);
    iVar3 = SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::size((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x6c3f4d);
    uVar8 = extraout_RDX;
    for (local_1234 = (iVar3 - in_stack_00000008) - 1; -1 < (int)local_1234;
        local_1234 = local_1234 - in_stack_00000010) {
      pcVar6 = IdxSet::index(local_1230,(char *)(ulong)local_1234,(int)uVar8);
      local_904 = (int)pcVar6;
      local_420 = local_1228 + local_904;
      local_418 = &local_800;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
      local_430 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe38c);
      local_428 = &local_900;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
      local_440 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe38c);
      local_438 = &local_880;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
      SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::baseId(in_stack_ffffffffffffe390,in_stack_ffffffffffffe38c);
      SVar4 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::dualStatus((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT17(in_stack_ffffffffffffe3b7,in_stack_ffffffffffffe3b0),
                           (SPxId *)in_stack_ffffffffffffe3a8);
      uVar8 = extraout_RDX_00;
      if (SVar4 != D_ON_BOTH) {
        local_1a0 = local_12b4;
        local_1a8 = in_R8;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_1a9,in_R8);
        local_190 = local_12b4;
        local_198 = local_1a8;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
        local_188 = local_12b4;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390);
        tVar2 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388),
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x6c4129);
        if (tVar2) {
          local_518 = local_1334;
          local_520 = &local_900;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                     (cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
          local_600 = infinity();
          local_5f8 = local_13b4;
          local_608 = 0;
          local_3c8 = local_600;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (in_stack_ffffffffffffe3a0,in_stack_ffffffffffffe398,in_stack_ffffffffffffe390);
          local_508 = local_1434;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                     (cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
          bVar1 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (in_stack_ffffffffffffe4a0,in_stack_ffffffffffffe498,
                             in_stack_ffffffffffffe490);
          local_1c21 = false;
          uVar8 = extraout_RDX_01;
          if (bVar1) {
            local_4f8 = local_14b4;
            local_500 = &local_880;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                       (cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
            local_4e8 = local_1534;
            local_4f0 = &local_900;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                       (cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
            local_4d8 = local_15b4;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                       (cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
            bVar1 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (in_stack_ffffffffffffe4a0,in_stack_ffffffffffffe498,
                               in_stack_ffffffffffffe490);
            local_1c21 = false;
            uVar8 = extraout_RDX_02;
            if (bVar1) {
              local_318 = local_1634;
              local_320 = &local_900;
              local_328 = in_R8;
              boost::multiprecision::detail::
              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
              ::
              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_329,local_320,in_R8);
              local_310 = local_1634;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390);
              local_2f8 = local_1634;
              local_300 = local_320;
              local_308 = local_328;
              boost::multiprecision::default_ops::
              eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                         (cpp_dec_float<200U,_int,_void> *)
                         CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388),
                         (cpp_dec_float<200U,_int,_void> *)0x6c43c2);
              local_1c21 = boost::multiprecision::operator>=
                                     ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)CONCAT44(in_stack_ffffffffffffe38c,
                                                  in_stack_ffffffffffffe388),
                                      (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)0x6c43d4);
              uVar8 = extraout_RDX_03;
            }
          }
          if (local_1c21 != false) {
            pnVar7 = local_670 + local_904;
            boost::multiprecision::number::operator_cast_to_double
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x6c4421);
            boost::multiprecision::number::operator_cast_to_double
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x6c4434);
            local_16c0 = Random::next((Random *)in_stack_ffffffffffffe3a0,in_stack_ffffffffffffe398,
                                      (Real)in_stack_ffffffffffffe390);
            local_e8 = local_16b4;
            local_f8 = &local_16c0;
            local_f0 = pnVar7;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_f9,pnVar7);
            local_e0 = local_16b4;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390);
            local_d0 = local_16b4;
            local_d8 = local_f0;
            local_c8 = local_f8;
            boost::multiprecision::default_ops::
            eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                      ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                       (cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388),
                       (double *)0x6c44fc);
            local_468 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe38c);
            local_470 = local_16b4;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                      ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                       (cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
            local_360 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe38c);
            local_358 = local_1740;
            local_368 = &local_900;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_369,local_360,local_368);
            local_350 = local_1740;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390);
            local_338 = local_1740;
            local_340 = local_360;
            local_348 = local_368;
            boost::multiprecision::default_ops::
            eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                       (cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388),
                       (cpp_dec_float<200U,_int,_void> *)0x6c4600);
            boost::multiprecision::
            number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            ::operator+=((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT17(in_stack_ffffffffffffe3b7,in_stack_ffffffffffffe3b0),
                         in_stack_ffffffffffffe3a8);
            uVar8 = extraout_RDX_04;
          }
        }
        else {
          tVar2 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388),
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x6c4636);
          uVar8 = extraout_RDX_05;
          if (tVar2) {
            local_4c8 = local_17c0;
            local_4d0 = &local_880;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                       (cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
            puVar5 = (ulong *)infinity();
            local_1848 = *puVar5 ^ 0x8000000000000000;
            local_5e0 = local_1840;
            local_5e8 = &local_1848;
            local_5f0 = 0;
            local_3d0 = local_5e8;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                      (in_stack_ffffffffffffe3a0,in_stack_ffffffffffffe398,in_stack_ffffffffffffe390
                      );
            local_4b8 = local_18c8;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                       (cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
            bVar1 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (in_R9,in_R8,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)CONCAT17(in_stack_ffffffffffffe417,in_stack_ffffffffffffe410));
            in_stack_ffffffffffffe3b7 = false;
            uVar8 = extraout_RDX_06;
            if (bVar1) {
              local_4a8 = local_1948;
              local_4b0 = &local_880;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                         (cpp_dec_float<200U,_int,_void> *)
                         CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
              local_498 = local_19c8;
              local_4a0 = &local_900;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                         (cpp_dec_float<200U,_int,_void> *)
                         CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
              local_488 = local_1a48;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                         (cpp_dec_float<200U,_int,_void> *)
                         CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
              bVar1 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (in_stack_ffffffffffffe4a0,in_stack_ffffffffffffe498,
                                 in_stack_ffffffffffffe490);
              in_stack_ffffffffffffe3b7 = false;
              uVar8 = extraout_RDX_07;
              if (bVar1) {
                in_stack_ffffffffffffe3a8 = local_670 + local_904;
                local_218 = local_1ac8;
                local_220 = &local_880;
                local_228 = in_R8;
                boost::multiprecision::detail::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                ::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_229,local_220,in_R8);
                local_210 = local_1ac8;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390);
                local_1f8 = local_1ac8;
                local_200 = local_220;
                local_208 = local_228;
                boost::multiprecision::default_ops::
                eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                           (cpp_dec_float<200U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388),
                           (cpp_dec_float<200U,_int,_void> *)0x6c48fb);
                in_stack_ffffffffffffe3b7 =
                     boost::multiprecision::operator<=
                               ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388),
                                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)0x6c490d);
                uVar8 = extraout_RDX_08;
              }
            }
            if ((type_conflict5)in_stack_ffffffffffffe3b7 != false) {
              in_stack_ffffffffffffe3a0 = &local_670[local_904].m_backend;
              in_stack_ffffffffffffe390 =
                   (SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)(in_RDI + 0x1368);
              in_stack_ffffffffffffe398 =
                   boost::multiprecision::number::operator_cast_to_double
                             ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)0x6c495a);
              boost::multiprecision::number::operator_cast_to_double
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x6c496d);
              local_1b50 = Random::next((Random *)in_stack_ffffffffffffe3a0,
                                        in_stack_ffffffffffffe398,(Real)in_stack_ffffffffffffe390);
              local_68 = local_1b48;
              local_78 = &local_1b50;
              local_70 = in_stack_ffffffffffffe3a0;
              boost::multiprecision::detail::
              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
              ::
              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_79,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffe3a0);
              local_60 = local_1b48;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390);
              local_50 = local_1b48;
              local_58 = local_70;
              local_48 = local_78;
              boost::multiprecision::default_ops::
              eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                        ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                         (cpp_dec_float<200U,_int,_void> *)
                         CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388),
                         (double *)0x6c4a35);
              local_478 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe38c);
              local_480 = local_1b48;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                        ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                         (cpp_dec_float<200U,_int,_void> *)
                         CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
              local_3a0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe38c);
              local_398 = local_1bd0;
              local_3a8 = &local_880;
              boost::multiprecision::detail::
              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
              ::
              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_3a9,local_3a0,local_3a8);
              local_390 = local_1bd0;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390);
              local_378 = local_1bd0;
              local_380 = local_3a0;
              local_388 = local_3a8;
              boost::multiprecision::default_ops::
              eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                         (cpp_dec_float<200U,_int,_void> *)
                         CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388),
                         (cpp_dec_float<200U,_int,_void> *)0x6c4b39);
              boost::multiprecision::
              number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              ::operator-=((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT17(in_stack_ffffffffffffe3b7,in_stack_ffffffffffffe3b0),
                           in_stack_ffffffffffffe3a8);
              uVar8 = extraout_RDX_09;
            }
          }
        }
      }
    }
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
    iVar3 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::dim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x6c3448);
    for (local_904 = (iVar3 - in_stack_00000008) + -1; -1 < local_904;
        local_904 = local_904 - in_stack_00000010) {
      local_3f0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe38c);
      local_3e8 = &local_900;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
      local_400 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe38c);
      local_3f8 = &local_880;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
      local_410 = local_670 + local_904;
      local_408 = &local_800;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
      local_5b8 = local_984;
      local_5c0 = &local_900;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
      local_630 = infinity();
      local_628 = local_a04;
      local_638 = 0;
      local_3b8 = local_630;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (in_stack_ffffffffffffe3a0,in_stack_ffffffffffffe398,in_stack_ffffffffffffe390);
      local_5a8 = local_a84;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
      bVar1 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_ffffffffffffe4a0,in_stack_ffffffffffffe498,
                         in_stack_ffffffffffffe490);
      uVar9 = false;
      if (bVar1) {
        local_598 = local_b04;
        local_5a0 = &local_880;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
        local_588 = local_b84;
        local_590 = &local_900;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
        local_578 = local_c04;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
        bVar1 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (in_stack_ffffffffffffe4a0,in_stack_ffffffffffffe498,
                           in_stack_ffffffffffffe490);
        uVar9 = false;
        if (bVar1) {
          local_1d8 = local_c84;
          local_1e0 = &local_800;
          local_1e8 = in_R8;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_1e9,local_1e0,in_R8);
          local_1d0 = local_c84;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390);
          local_1b8 = local_c84;
          local_1c0 = local_1e0;
          local_1c8 = local_1e8;
          boost::multiprecision::default_ops::
          eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                     (cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388),
                     (cpp_dec_float<200U,_int,_void> *)0x6c37a7);
          uVar9 = boost::multiprecision::operator<=
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388),
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x6c37bc);
        }
      }
      if ((type_conflict5)uVar9 != false) {
        boost::multiprecision::number::operator_cast_to_double
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)0x6c37f3);
        boost::multiprecision::number::operator_cast_to_double
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)0x6c3809);
        local_d10 = Random::next((Random *)in_stack_ffffffffffffe3a0,in_stack_ffffffffffffe398,
                                 (Real)in_stack_ffffffffffffe390);
        local_a8 = local_d04;
        local_b0 = &local_800;
        local_b8 = &local_d10;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_b9,local_b0);
        local_a0 = local_d04;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390);
        local_90 = local_d04;
        local_98 = local_b0;
        local_88 = local_b8;
        boost::multiprecision::default_ops::
        eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388),(double *)0x6c38d7)
        ;
        local_448 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe38c);
        local_450 = local_d04;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
        local_260 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe38c);
        local_258 = local_d90;
        local_268 = &local_900;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_269,local_260,local_268);
        local_250 = local_d90;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390);
        local_238 = local_d90;
        local_240 = local_260;
        local_248 = local_268;
        boost::multiprecision::default_ops::
        eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388),
                   (cpp_dec_float<200U,_int,_void> *)0x6c39db);
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        ::operator+=((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT17(in_stack_ffffffffffffe3b7,in_stack_ffffffffffffe3b0),
                     in_stack_ffffffffffffe3a8);
      }
      local_568 = local_e10;
      local_570 = &local_880;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
      puVar5 = (ulong *)infinity();
      local_e98 = *puVar5 ^ 0x8000000000000000;
      local_610 = local_e90;
      local_618 = &local_e98;
      local_620 = 0;
      local_3c0 = local_618;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (in_stack_ffffffffffffe3a0,in_stack_ffffffffffffe398,in_stack_ffffffffffffe390);
      local_558 = local_f18;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
      bVar1 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_R9,in_R8,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT17(uVar9,in_stack_ffffffffffffe410));
      local_1c01 = false;
      if (bVar1) {
        local_548 = local_f98;
        local_550 = &local_880;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
        local_538 = local_1018;
        local_540 = &local_900;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
        local_528 = local_1098;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
        bVar1 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (in_stack_ffffffffffffe4a0,in_stack_ffffffffffffe498,
                           in_stack_ffffffffffffe490);
        local_1c01 = false;
        if (bVar1) {
          local_298 = local_1118;
          local_2a0 = &local_800;
          local_2a8 = in_R8;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_2a9,local_2a0,in_R8);
          local_290 = local_1118;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390);
          local_278 = local_1118;
          local_280 = local_2a0;
          local_288 = local_2a8;
          boost::multiprecision::default_ops::
          eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                     (cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388),
                     (cpp_dec_float<200U,_int,_void> *)0x6c3c97);
          local_1c01 = boost::multiprecision::operator>=
                                 ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388),
                                  (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)0x6c3cac);
        }
      }
      if (local_1c01 != false) {
        boost::multiprecision::number::operator_cast_to_double
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)0x6c3cdd);
        boost::multiprecision::number::operator_cast_to_double
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)0x6c3cf0);
        local_11a0 = Random::next((Random *)in_stack_ffffffffffffe3a0,in_stack_ffffffffffffe398,
                                  (Real)in_stack_ffffffffffffe390);
        local_28 = local_1198;
        local_30 = &local_800;
        local_38 = &local_11a0;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_39,local_30);
        local_20 = local_1198;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390);
        local_10 = local_1198;
        local_18 = local_30;
        local_8 = local_38;
        boost::multiprecision::default_ops::
        eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388),(double *)0x6c3dbb)
        ;
        local_458 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe38c);
        local_460 = local_1198;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388));
        local_2e0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe38c);
        local_2d8 = local_1220;
        local_2e8 = &local_880;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_2e9,local_2e0,local_2e8);
        local_2d0 = local_1220;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390);
        local_2b8 = local_1220;
        local_2c0 = local_2e0;
        local_2c8 = local_2e8;
        boost::multiprecision::default_ops::
        eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe390,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388),
                   (cpp_dec_float<200U,_int,_void> *)0x6c3ebf);
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        ::operator-=((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT17(in_stack_ffffffffffffe3b7,in_stack_ffffffffffffe3b0),
                     in_stack_ffffffffffffe3a8);
      }
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::perturbMin(
   const UpdateVector<R>& uvec,
   VectorBase<R>& p_low,
   VectorBase<R>& p_up,
   R eps,
   R p_delta,
   int start,
   int incr)
{
   assert(uvec.dim() == p_low.dim());
   assert(uvec.dim() == p_up.dim());

   const R* vec = uvec.get_const_ptr();
   R minrandom = 10.0 * p_delta;
   R maxrandom = 100.0 * p_delta;
   R x, l, u;
   int i;

   if(fullPerturbation)
   {
      eps = p_delta;

      for(i = uvec.dim() - start - 1; i >= 0; i -= incr)
      {
         u = p_up[i];
         l = p_low[i];
         x = vec[i];

         if(LT(u, R(infinity), eps) && NE(l, u, eps) && u <= x + eps)
         {
            p_up[i] = x + random.next((double) minrandom, (double)maxrandom);
            theShift += p_up[i] - u;
         }

         if(GT(l, R(-infinity), eps) && NE(l, u, eps) && l >= x - eps)
         {
            p_low[i] = x - random.next((double)minrandom, (double)maxrandom);
            theShift -= p_low[i] - l;
         }
      }
   }
   else
   {
      const R* upd = uvec.delta().values();
      const IdxSet& idx = uvec.delta().indices();

      for(int j = uvec.delta().size() - start - 1; j >= 0; j -= incr)
      {
         i = idx.index(j);
         x = upd[i];
         u = p_up[i];
         l = p_low[i];

         // do not permute these bounds! c.f. with computeFrhs2() in spxvecs.cpp
         if(this->dualStatus(this->baseId(i)) == SPxBasisBase<R>::Desc::D_ON_BOTH)
         {
            continue;
         }

         if(x < -eps)
         {
            if(LT(u, R(infinity), eps) && NE(l, u, eps) && vec[i] >= u - eps)
            {
               p_up[i] = vec[i] + random.next((double)minrandom, (double)maxrandom);
               theShift += p_up[i] - u;
            }
         }
         else if(x > eps)
         {
            if(GT(l, R(-infinity), eps) && NE(l, u, eps) && vec[i] <= l + eps)
            {
               p_low[i] = vec[i] - random.next((double)minrandom, (double)maxrandom);
               theShift -= p_low[i] - l;
            }
         }
      }
   }
}